

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_array_defs.h
# Opt level: O1

ON_ClassArray<ON_CurveProxyHistory> * __thiscall
ON_ClassArray<ON_CurveProxyHistory>::operator=
          (ON_ClassArray<ON_CurveProxyHistory> *this,ON_ClassArray<ON_CurveProxyHistory> *src)

{
  int iVar1;
  unsigned_short uVar2;
  unsigned_short uVar3;
  long lVar4;
  long lVar5;
  ON_ObjRef *pOVar6;
  ON_ObjRef *pOVar7;
  long lVar8;
  byte bVar9;
  
  bVar9 = 0;
  if (this != src) {
    iVar1 = src->m_count;
    if ((long)iVar1 < 1) {
      this->m_count = 0;
    }
    else {
      if (this->m_capacity < iVar1) {
        SetCapacity(this,(long)iVar1);
      }
      if ((this->m_a != (ON_CurveProxyHistory *)0x0) &&
         (iVar1 = src->m_count, this->m_count = iVar1, 0 < iVar1)) {
        lVar8 = 0;
        lVar5 = 0;
        do {
          pOVar6 = (ON_ObjRef *)((src->m_a->m_curve_ref).m_uuid.Data4 + lVar8 + -8);
          pOVar7 = (ON_ObjRef *)((this->m_a->m_curve_ref).m_uuid.Data4 + lVar8 + -8);
          ON_ObjRef::operator=(pOVar7,pOVar6);
          pOVar6 = pOVar6 + 1;
          pOVar7 = pOVar7 + 1;
          for (lVar4 = 0xf; lVar4 != 0; lVar4 = lVar4 + -1) {
            uVar2 = (pOVar6->m_uuid).Data2;
            uVar3 = (pOVar6->m_uuid).Data3;
            (pOVar7->m_uuid).Data1 = (pOVar6->m_uuid).Data1;
            (pOVar7->m_uuid).Data2 = uVar2;
            (pOVar7->m_uuid).Data3 = uVar3;
            pOVar6 = (ON_ObjRef *)((long)pOVar6 + (ulong)bVar9 * -0x10 + 8);
            pOVar7 = (ON_ObjRef *)((long)pOVar7 + (ulong)bVar9 * -0x10 + 8);
          }
          lVar5 = lVar5 + 1;
          lVar8 = lVar8 + 0x158;
        } while (lVar5 < this->m_count);
      }
    }
  }
  return this;
}

Assistant:

ON_ClassArray<T>& ON_ClassArray<T>::operator=( const ON_ClassArray<T>& src )
{
  int i;
  if( this != &src ) {
    if ( src.m_count <= 0 ) {
      m_count = 0;
    }
    else {
      if ( m_capacity < src.m_count ) {
        SetCapacity( src.m_count );
      }
      if ( m_a ) {
        m_count = src.m_count;
        for ( i = 0; i < m_count; i++ ) {
          m_a[i] = src.m_a[i];
        }
      }
    }
  }  
  return *this;
}